

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O3

acmod_id_t acmod_set_enum(void)

{
  uint uVar1;
  cell_t *pcVar2;
  cell_index_t cVar3;
  cell_index_t cVar4;
  
  pcVar2 = base->cell;
  cVar4 = pcVar2[posn].sib;
  if (cVar4 == 0xffffffff) {
    cVar3 = pcVar2[right].sib;
    if (cVar3 == 0xffffffff) {
      uVar1 = pcVar2[left].sib;
      if ((ulong)uVar1 == 0xffffffff) {
        return 0xffffffff;
      }
      cVar3 = pcVar2[uVar1].child;
      left = uVar1;
    }
    cVar4 = pcVar2[cVar3].child;
    right = cVar3;
  }
  posn = cVar4;
  return pcVar2[cVar4].child;
}

Assistant:

acmod_id_t
acmod_set_enum()
{
    cell_index_t ret;

    ret = itree_enum();

    if (ret != NULL_INDEX) {
	return ret;
    }
    else {
	return NO_ACMOD;
    }
}